

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O1

void __thiscall Spc_Dsp::mute_voices(Spc_Dsp *this,int mask)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  uint8_t *puVar5;
  int enabled;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  (this->m).mute_mask = mask;
  iVar1 = (this->m).surround_threshold;
  piVar2 = &(this->m).voices[0].enabled;
  puVar5 = (this->m).regs + 1;
  lVar3 = 0;
  do {
    uVar6 = (((uint)mask >> ((uint)lVar3 & 0x1f) & 1) != 0) - 1;
    *piVar2 = uVar6;
    uVar7 = (uint)(char)((state_t *)(puVar5 + -1))->regs[0];
    uVar8 = (uint)(char)*puVar5;
    if ((int)(uVar8 * uVar7) < iVar1) {
      uVar4 = (int)uVar7 >> 7;
      uVar9 = (int)uVar8 >> 7;
    }
    else {
      uVar9 = 0;
      uVar4 = 0;
    }
    piVar2[-2] = (uVar4 ^ uVar7) & uVar6;
    piVar2[-1] = (uVar9 ^ uVar8) & uVar6;
    lVar3 = lVar3 + 1;
    piVar2 = piVar2 + 0x24;
    puVar5 = puVar5 + 0x10;
  } while (lVar3 != 8);
  return;
}

Assistant:

void Spc_Dsp::mute_voices( int mask )
{
	m.mute_mask = mask;
	for ( int i = 0; i < voice_count; i++ )
	{
		m.voices [i].enabled = (mask >> i & 1) - 1;
		update_voice_vol( i * 0x10 );
	}
}